

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

bool __thiscall MT32Emu::Synth::isActive(Synth *this)

{
  bool bVar1;
  int iVar2;
  
  if (this->opened == true) {
    if (this->midiQueue->startPosition != this->midiQueue->endPosition) {
      return true;
    }
    bVar1 = hasActivePartials(this);
    if (bVar1) {
      return true;
    }
    if ((this->reverbModel != (BReverbModel *)0x0) &&
       (iVar2 = (*this->reverbModel->_vptr_BReverbModel[7])(), (char)iVar2 != '\0')) {
      return true;
    }
    this->activated = false;
  }
  return false;
}

Assistant:

bool Synth::isActive() {
	if (!opened) {
		return false;
	}
	if (!midiQueue->isEmpty() || hasActivePartials()) {
		return true;
	}
	if (isReverbEnabled() && reverbModel->isActive()) {
		return true;
	}
	activated = false;
	return false;
}